

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O0

shared_handle __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::try_lock_shared
          (cow_guarded<int,_std::timed_mutex> *this)

{
  bool bVar1;
  type psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_handle sVar4;
  undefined1 local_30 [8];
  shared_handle slock;
  cow_guarded<int,_std::timed_mutex> *this_local;
  shared_handle *retval;
  
  slock._M_t.
  super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>._M_head_impl._7_1_ = 0;
  std::shared_ptr<const_int>::shared_ptr((shared_ptr<const_int> *)this);
  lr_guarded<std::shared_ptr<const_int>,_std::mutex>::try_lock_shared
            ((lr_guarded<std::shared_ptr<const_int>,_std::mutex> *)local_30);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
  if (bVar1) {
    psVar2 = std::
             unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
             ::operator*((unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                          *)local_30);
    std::shared_ptr<const_int>::operator=((shared_ptr<const_int> *)this,psVar2);
  }
  slock._M_t.
  super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>._M_head_impl._7_1_ = 1;
  std::
  unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  ::~unique_ptr((unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                 *)local_30);
  _Var3._M_pi = extraout_RDX;
  if ((slock._M_t.
       super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
       .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>._M_head_impl._7_1_ & 1) ==
      0) {
    std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_handle)sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto cow_guarded<T, M>::try_lock_shared() const -> shared_handle
{
    shared_handle retval;

    auto slock = m_data.try_lock_shared();
    if (slock) {
        retval = *slock;
    }

    return retval;
}